

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O0

bool common_download_file_single(string *url,string *path,string *bearer_token)

{
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  init;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  init_00;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  init_01;
  initializer_list_t init_02;
  curl_slist_ptr cVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  common_log *pcVar5;
  pointer pvVar6;
  undefined8 uVar7;
  ulong uVar8;
  reference pvVar9;
  _func_size_t_char_ptr_size_t_size_t_void_ptr *p_Var10;
  char *pcVar11;
  _func_size_t_void_ptr_size_t_size_t_void_ptr *p_Var12;
  pointer p_Var13;
  undefined8 uVar14;
  char *__new;
  long http_code_1;
  bool was_perform_successful_1;
  anon_class_1_0_00000001 llama_download_hide_password_in_url;
  anon_class_1_0_00000001 write_callback;
  unique_ptr<_IO_FILE,_FILE_deleter> outfile;
  string path_temporary;
  bool should_download;
  long http_code;
  bool was_perform_successful;
  anon_class_1_0_00000001 header_callback;
  common_load_model_from_url_headers headers;
  exception *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> previous_url;
  ifstream metadata_in;
  string last_modified;
  string etag;
  json metadata;
  string metadata_path;
  bool file_exists;
  string auth_header;
  bool force_download;
  curl_slist_ptr http_headers;
  curl_ptr curl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff588;
  common_load_model_from_url_headers *in_stack_fffffffffffff590;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff598;
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *in_stack_fffffffffffff5a0;
  iterator in_stack_fffffffffffff5a8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff5b0;
  int in_stack_fffffffffffff5b8;
  int in_stack_fffffffffffff5bc;
  CURL *in_stack_fffffffffffff5c0;
  string *in_stack_fffffffffffff5c8;
  undefined7 in_stack_fffffffffffff5d0;
  undefined1 in_stack_fffffffffffff5d7;
  const_reference in_stack_fffffffffffff5d8;
  undefined7 in_stack_fffffffffffff5e0;
  format in_stack_fffffffffffff5e7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5e8;
  path *in_stack_fffffffffffff5f0;
  string *in_stack_fffffffffffff620;
  anon_class_1_0_00000001 *in_stack_fffffffffffff628;
  char (*in_stack_fffffffffffff638) [13];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff640;
  undefined1 **local_990;
  undefined8 in_stack_fffffffffffff688;
  undefined2 uVar16;
  undefined8 **ppuVar15;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff690;
  undefined8 **ppuVar17;
  iterator in_stack_fffffffffffff698;
  istream *in_stack_fffffffffffff6a0;
  undefined1 **local_948;
  byte local_8a1;
  string local_7d0 [32];
  undefined1 local_7b0 [12];
  error_handler_t in_stack_fffffffffffff85c;
  undefined1 in_stack_fffffffffffff862;
  char in_stack_fffffffffffff863;
  int in_stack_fffffffffffff864;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff868;
  undefined1 *local_5a0 [6];
  undefined8 *local_570;
  undefined8 local_568;
  undefined8 *local_560;
  undefined1 *local_558 [3];
  undefined1 local_540 [24];
  undefined8 *local_528;
  undefined8 local_520;
  undefined8 *local_518;
  undefined1 *local_510 [3];
  undefined1 local_4f8 [24];
  undefined8 *local_4e0;
  undefined8 local_4d8;
  undefined8 *local_4d0;
  undefined1 *local_4c8 [3];
  undefined1 local_4b0 [24];
  undefined1 local_498 [24];
  undefined8 *local_480;
  undefined8 local_478;
  long local_460;
  undefined1 local_451;
  string local_450 [39];
  __1 local_429 [9];
  string local_420 [39];
  byte local_3f9;
  long local_3f8;
  undefined1 local_3ea;
  __0 local_3e9;
  undefined1 local_3e8 [72];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  undefined1 local_320 [520];
  string local_118 [32];
  string local_f8 [48];
  string local_c8 [79];
  byte local_79;
  string local_78 [39];
  byte local_51;
  int local_50;
  curl_slist_ptr local_40;
  code *local_38;
  byte local_1;
  
  uVar16 = (undefined2)((ulong)in_stack_fffffffffffff688 >> 0x30);
  curl_easy_init();
  local_38 = curl_easy_cleanup;
  std::unique_ptr<void,void(*)(void*)>::unique_ptr<void(*)(void*),void>
            ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffff590,
             in_stack_fffffffffffff588,
             (__enable_if_t<_is_lvalue_reference<void_(*)(void_*)>::value,_void_(*&&)(void_*)>)
             0x1a1ccb);
  curl_slist_ptr::curl_slist_ptr(&local_40);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr<void,_void_(*)(void_*)> *)0x1a1ce5);
  if (!bVar2) {
    if (-1 < common_log_verbosity_thold) {
      pcVar5 = common_log_main();
      common_log_add(pcVar5,GGML_LOG_LEVEL_ERROR,"%s: error initializing libcurl\n",
                     "common_download_file_single");
    }
    local_1 = 0;
    local_50 = 1;
    goto LAB_001a377a;
  }
  local_51 = 0;
  pvVar6 = std::unique_ptr<void,_void_(*)(void_*)>::get
                     ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffff590);
  uVar7 = std::__cxx11::string::c_str();
  curl_easy_setopt(pvVar6,0x2712,uVar7);
  pvVar6 = std::unique_ptr<void,_void_(*)(void_*)>::get
                     ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffff590);
  curl_easy_setopt(pvVar6,0x34,1);
  local_40.ptr = (curl_slist *)curl_slist_append(local_40.ptr,"User-Agent: llama-cpp");
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    std::operator+((char *)in_stack_fffffffffffff5d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff5d7,in_stack_fffffffffffff5d0));
    cVar1.ptr = local_40.ptr;
    uVar7 = std::__cxx11::string::c_str();
    local_40.ptr = (curl_slist *)curl_slist_append(cVar1.ptr,uVar7);
    std::__cxx11::string::~string(local_78);
  }
  pvVar6 = std::unique_ptr<void,_void_(*)(void_*)>::get
                     ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffff590);
  curl_easy_setopt(pvVar6,0x2727,local_40.ptr);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e7);
  bVar2 = std::filesystem::exists((path *)in_stack_fffffffffffff590);
  std::filesystem::__cxx11::path::~path((path *)in_stack_fffffffffffff590);
  local_79 = bVar2;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                 (char *)in_stack_fffffffffffff5b0);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  std::__cxx11::string::string(local_f8);
  std::__cxx11::string::string(local_118);
  if ((local_79 & 1) == 0) {
    if (-1 < common_log_verbosity_thold) {
      pcVar5 = common_log_main();
      uVar7 = std::__cxx11::string::c_str();
      common_log_add(pcVar5,GGML_LOG_LEVEL_INFO,"%s: no previous model file found %s\n",
                     "common_download_file_single",uVar7);
    }
LAB_001a2593:
    common_download_file_single::common_load_model_from_url_headers::
    common_load_model_from_url_headers(in_stack_fffffffffffff590);
    pvVar6 = std::unique_ptr<void,_void_(*)(void_*)>::get
                       ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffff590);
    curl_easy_setopt(pvVar6,0x2c,1);
    pvVar6 = std::unique_ptr<void,_void_(*)(void_*)>::get
                       ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffff590);
    curl_easy_setopt(pvVar6,0x2b,1);
    pvVar6 = std::unique_ptr<void,_void_(*)(void_*)>::get
                       ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffff590);
    p_Var10 = common_download_file_single(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
              ::$_0::operator_cast_to_function_pointer(&local_3e9);
    curl_easy_setopt(pvVar6,0x4e6f,p_Var10);
    pvVar6 = std::unique_ptr<void,_void_(*)(void_*)>::get
                       ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffff590);
    curl_easy_setopt(pvVar6,0x272d,local_3e8);
    std::unique_ptr<void,_void_(*)(void_*)>::get
              ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffff590);
    local_3ea = curl_perform_with_retry
                          (in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
                           in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8);
    if ((bool)local_3ea) {
      local_3f8 = 0;
      pvVar6 = std::unique_ptr<void,_void_(*)(void_*)>::get
                         ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffff590);
      curl_easy_getinfo(pvVar6,0x200002,&local_3f8);
      if ((local_3f8 != 200) && (local_51 = 1, -1 < common_log_verbosity_thold)) {
        pcVar5 = common_log_main();
        common_log_add(pcVar5,GGML_LOG_LEVEL_ERROR,
                       "%s: HEAD invalid http status code received: %ld\n",
                       "common_download_file_single",local_3f8);
      }
      local_8a1 = 1;
      if ((local_79 & 1) != 0) {
        local_8a1 = local_51;
      }
      local_3f9 = local_8a1 & 1;
      if (local_3f9 == 0) {
        uVar8 = std::__cxx11::string::empty();
        if (((uVar8 & 1) == 0) &&
           (bVar2 = std::operator!=(&in_stack_fffffffffffff590->etag,in_stack_fffffffffffff588),
           bVar2)) {
          if (-1 < common_log_verbosity_thold) {
            pcVar5 = common_log_main();
            uVar7 = std::__cxx11::string::c_str();
            uVar14 = std::__cxx11::string::c_str();
            common_log_add(pcVar5,GGML_LOG_LEVEL_WARN,
                           "%s: ETag header is different (%s != %s): triggering a new download\n",
                           "common_download_file_single",uVar7,uVar14);
          }
          local_3f9 = 1;
        }
        else {
          uVar8 = std::__cxx11::string::empty();
          if (((uVar8 & 1) == 0) &&
             (bVar2 = std::operator!=(&in_stack_fffffffffffff590->etag,in_stack_fffffffffffff588),
             bVar2)) {
            if (-1 < common_log_verbosity_thold) {
              pcVar5 = common_log_main();
              uVar7 = std::__cxx11::string::c_str();
              uVar14 = std::__cxx11::string::c_str();
              common_log_add(pcVar5,GGML_LOG_LEVEL_WARN,
                             "%s: Last-Modified header is different (%s != %s): triggering a new download\n"
                             ,"common_download_file_single",uVar7,uVar14);
            }
            local_3f9 = 1;
          }
        }
      }
      if ((local_3f9 & 1) != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                       (char *)in_stack_fffffffffffff5b0);
        if ((local_79 & 1) == 0) {
LAB_001a2a4a:
          pcVar11 = (char *)std::__cxx11::string::c_str();
          fopen(pcVar11,"wb");
          std::
          unique_ptr<_IO_FILE,common_download_file_single(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::FILE_deleter>
          ::
          unique_ptr<common_download_file_single(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::FILE_deleter,void>
                    ((unique_ptr<_IO_FILE,_FILE_deleter> *)in_stack_fffffffffffff590,
                     (pointer)in_stack_fffffffffffff588);
          bVar2 = std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr<_IO_FILE,_FILE_deleter> *)0x1a2a92);
          if (bVar2) {
            pvVar6 = std::unique_ptr<void,_void_(*)(void_*)>::get
                               ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffff590);
            curl_easy_setopt(pvVar6,0x2c,0);
            pvVar6 = std::unique_ptr<void,_void_(*)(void_*)>::get
                               ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffff590);
            p_Var12 = common_download_file_single(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
                      ::$_1::operator_cast_to_function_pointer(local_429);
            curl_easy_setopt(pvVar6,0x4e2b,p_Var12);
            pvVar6 = std::unique_ptr<void,_void_(*)(void_*)>::get
                               ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffff590);
            p_Var13 = std::unique_ptr<_IO_FILE,_FILE_deleter>::get
                                ((unique_ptr<_IO_FILE,_FILE_deleter> *)in_stack_fffffffffffff590);
            curl_easy_setopt(pvVar6,0x2711,p_Var13);
            pvVar6 = std::unique_ptr<void,_void_(*)(void_*)>::get
                               ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffff590);
            curl_easy_setopt(pvVar6,0x2b,0);
            if (-1 < common_log_verbosity_thold) {
              pcVar5 = common_log_main();
              common_download_file_single(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
              ::$_2::operator()::string_const___const
                        (in_stack_fffffffffffff628,in_stack_fffffffffffff620);
              uVar7 = std::__cxx11::string::c_str();
              uVar14 = std::__cxx11::string::c_str();
              in_stack_fffffffffffff588 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::__cxx11::string::c_str();
              in_stack_fffffffffffff590 =
                   (common_load_model_from_url_headers *)std::__cxx11::string::c_str();
              common_log_add(pcVar5,GGML_LOG_LEVEL_INFO,
                             "%s: trying to download model from %s to %s (server_etag:%s, server_last_modified:%s)...\n"
                             ,"common_download_file_single",uVar7,uVar14);
              std::__cxx11::string::~string(local_450);
            }
            std::unique_ptr<void,_void_(*)(void_*)>::get
                      ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffff590);
            local_451 = curl_perform_with_retry
                                  (in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
                                   in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8);
            if ((bool)local_451) {
              local_460 = 0;
              pvVar6 = std::unique_ptr<void,_void_(*)(void_*)>::get
                                 ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffff590);
              curl_easy_getinfo(pvVar6,0x200002,&local_460);
              if ((local_460 < 200) || (399 < local_460)) {
                if (-1 < common_log_verbosity_thold) {
                  pcVar5 = common_log_main();
                  common_log_add(pcVar5,GGML_LOG_LEVEL_ERROR,
                                 "%s: invalid http status code received: %ld\n",
                                 "common_download_file_single",local_460);
                }
                local_1 = 0;
                local_50 = 1;
              }
              else {
                std::unique_ptr<_IO_FILE,_FILE_deleter>::reset
                          ((unique_ptr<_IO_FILE,_FILE_deleter> *)in_stack_fffffffffffff590,
                           (pointer)in_stack_fffffffffffff588);
                local_4d0 = local_4c8;
                local_518 = local_510;
                nlohmann::json_abi_v3_11_3::detail::
                json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::json_ref<const_char_(&)[4],_0>
                          ((json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)in_stack_fffffffffffff590,(char (*) [4])in_stack_fffffffffffff588);
                local_518 = (undefined8 *)local_4f8;
                nlohmann::json_abi_v3_11_3::detail::
                json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::
                json_ref<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                          ((json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)in_stack_fffffffffffff590,in_stack_fffffffffffff588);
                local_4e0 = local_510;
                local_4d8 = 2;
                init._M_len = (size_type)in_stack_fffffffffffff5b0;
                init._M_array = in_stack_fffffffffffff5a8;
                nlohmann::json_abi_v3_11_3::detail::
                json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::json_ref(in_stack_fffffffffffff5a0,init);
                local_4d0 = (undefined8 *)local_4b0;
                local_560 = local_558;
                nlohmann::json_abi_v3_11_3::detail::
                json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::json_ref<const_char_(&)[5],_0>
                          ((json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)in_stack_fffffffffffff590,(char (*) [5])in_stack_fffffffffffff588);
                local_560 = (undefined8 *)local_540;
                nlohmann::json_abi_v3_11_3::detail::
                json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::
                json_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                          ((json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)in_stack_fffffffffffff590,in_stack_fffffffffffff588);
                local_528 = local_558;
                local_520 = 2;
                init_00._M_len = (size_type)in_stack_fffffffffffff5b0;
                init_00._M_array = in_stack_fffffffffffff5a8;
                nlohmann::json_abi_v3_11_3::detail::
                json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::json_ref(in_stack_fffffffffffff5a0,init_00);
                local_4d0 = (undefined8 *)local_498;
                nlohmann::json_abi_v3_11_3::detail::
                json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::json_ref<const_char_(&)[13],_0>
                          ((json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)in_stack_fffffffffffff590,(char (*) [13])in_stack_fffffffffffff588);
                nlohmann::json_abi_v3_11_3::detail::
                json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::
                json_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                          ((json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)in_stack_fffffffffffff590,in_stack_fffffffffffff588);
                local_570 = local_5a0;
                local_568 = 2;
                init_01._M_len = (size_type)in_stack_fffffffffffff5b0;
                init_01._M_array = in_stack_fffffffffffff5a8;
                nlohmann::json_abi_v3_11_3::detail::
                json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::json_ref(in_stack_fffffffffffff5a0,init_01);
                local_480 = local_4c8;
                local_478 = 3;
                init_02._M_len = (size_type)in_stack_fffffffffffff6a0;
                init_02._M_array = in_stack_fffffffffffff698;
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::basic_json(in_stack_fffffffffffff690,init_02,SUB21((ushort)uVar16 >> 8,0),
                             (value_t)uVar16);
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::update((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0),
                         in_stack_fffffffffffff5d8,(bool)in_stack_fffffffffffff5d7);
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)in_stack_fffffffffffff590);
                local_948 = (undefined1 **)&local_480;
                do {
                  local_948 = local_948 + -3;
                  nlohmann::json_abi_v3_11_3::detail::
                  json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)0x1a307a);
                } while (local_948 != local_4c8);
                ppuVar15 = (undefined8 **)local_5a0;
                ppuVar17 = &local_570;
                do {
                  ppuVar17 = ppuVar17 + -3;
                  nlohmann::json_abi_v3_11_3::detail::
                  json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)0x1a30cc);
                } while (ppuVar17 != ppuVar15);
                ppuVar15 = &local_528;
                do {
                  ppuVar15 = ppuVar15 + -3;
                  nlohmann::json_abi_v3_11_3::detail::
                  json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)0x1a311e);
                } while (ppuVar15 != (undefined8 **)local_558);
                local_990 = (undefined1 **)&local_4e0;
                do {
                  local_990 = local_990 + -3;
                  nlohmann::json_abi_v3_11_3::detail::
                  json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                  ::~json_ref((json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)0x1a3170);
                } while (local_990 != local_510);
                std::ofstream::ofstream(local_7b0,local_c8,_S_out);
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::dump(in_stack_fffffffffffff868,in_stack_fffffffffffff864,in_stack_fffffffffffff863
                       ,(bool)in_stack_fffffffffffff862,in_stack_fffffffffffff85c);
                std::operator<<((basic_ofstream<char,_std::char_traits<char>_> *)
                                in_stack_fffffffffffff590,in_stack_fffffffffffff588);
                std::__cxx11::string::~string(local_7d0);
                std::ofstream::~ofstream(local_7b0);
                if (-1 < common_log_verbosity_thold) {
                  pcVar5 = common_log_main();
                  uVar7 = std::__cxx11::string::c_str();
                  common_log_add(pcVar5,GGML_LOG_LEVEL_INFO,"%s: file metadata saved: %s\n",
                                 "common_download_file_single",uVar7);
                }
                pcVar11 = (char *)std::__cxx11::string::c_str();
                __new = (char *)std::__cxx11::string::c_str();
                iVar4 = rename(pcVar11,__new);
                if (iVar4 == 0) {
                  local_50 = 0;
                }
                else {
                  if (-1 < common_log_verbosity_thold) {
                    pcVar5 = common_log_main();
                    in_stack_fffffffffffff5a0 =
                         (json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)std::__cxx11::string::c_str();
                    uVar7 = std::__cxx11::string::c_str();
                    common_log_add(pcVar5,GGML_LOG_LEVEL_ERROR,
                                   "%s: unable to rename file: %s to %s\n",
                                   "common_download_file_single",in_stack_fffffffffffff5a0,uVar7);
                  }
                  local_1 = 0;
                  local_50 = 1;
                }
              }
            }
            else {
              local_1 = 0;
              local_50 = 1;
            }
          }
          else {
            if (-1 < common_log_verbosity_thold) {
              pcVar5 = common_log_main();
              uVar7 = std::__cxx11::string::c_str();
              common_log_add(pcVar5,GGML_LOG_LEVEL_ERROR,
                             "%s: error opening local file for writing: %s\n",
                             "common_download_file_single",uVar7);
            }
            local_1 = 0;
            local_50 = 1;
          }
          std::unique_ptr<_IO_FILE,_FILE_deleter>::~unique_ptr
                    ((unique_ptr<_IO_FILE,_FILE_deleter> *)in_stack_fffffffffffff590);
        }
        else {
          if (-1 < common_log_verbosity_thold) {
            pcVar5 = common_log_main();
            uVar7 = std::__cxx11::string::c_str();
            common_log_add(pcVar5,GGML_LOG_LEVEL_WARN,"%s: deleting previous downloaded file: %s\n",
                           "common_download_file_single",uVar7);
          }
          pcVar11 = (char *)std::__cxx11::string::c_str();
          iVar4 = remove(pcVar11);
          if (iVar4 == 0) goto LAB_001a2a4a;
          if (-1 < common_log_verbosity_thold) {
            pcVar5 = common_log_main();
            uVar7 = std::__cxx11::string::c_str();
            common_log_add(pcVar5,GGML_LOG_LEVEL_ERROR,"%s: unable to delete file: %s\n",
                           "common_download_file_single",uVar7);
          }
          local_1 = 0;
          local_50 = 1;
        }
        std::__cxx11::string::~string(local_420);
        if (local_50 != 0) goto LAB_001a36f0;
      }
      local_1 = 1;
      local_50 = 1;
    }
    else {
      local_1 = 0;
      local_50 = 1;
    }
LAB_001a36f0:
    common_download_file_single::common_load_model_from_url_headers::
    ~common_load_model_from_url_headers(in_stack_fffffffffffff590);
  }
  else {
    std::ifstream::ifstream(local_320,local_c8,_S_in);
    bVar3 = std::ios::good();
    if ((bVar3 & 1) == 0) {
LAB_001a24fc:
      local_50 = 0;
    }
    else {
      nlohmann::json_abi_v3_11_3::operator>>
                (in_stack_fffffffffffff6a0,&in_stack_fffffffffffff698->owned_value);
      if (-1 < common_log_verbosity_thold) {
        pcVar5 = common_log_main();
        uVar7 = std::__cxx11::string::c_str();
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::dump(in_stack_fffffffffffff868,in_stack_fffffffffffff864,in_stack_fffffffffffff863,
               (bool)in_stack_fffffffffffff862,in_stack_fffffffffffff85c);
        uVar14 = std::__cxx11::string::c_str();
        common_log_add(pcVar5,GGML_LOG_LEVEL_INFO,"%s: previous metadata file found %s: %s\n",
                       "common_download_file_single",uVar7,uVar14);
        std::__cxx11::string::~string(local_340);
      }
      bVar2 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::contains<const_char_(&)[4],_0>
                        (in_stack_fffffffffffff5b0,(char (*) [4])in_stack_fffffffffffff5a8);
      if (!bVar2) {
LAB_001a2351:
        bVar2 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::contains<const_char_(&)[5],_0>
                          (in_stack_fffffffffffff5b0,(char (*) [5])in_stack_fffffffffffff5a8);
        if (bVar2) {
          pvVar9 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::at<const_char_(&)[5],_0>
                             (in_stack_fffffffffffff640,(char (*) [5])in_stack_fffffffffffff638);
          bVar2 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::is_string(pvVar9);
          if (bVar2) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::at<const_char_(&)[5],_0>
                      (in_stack_fffffffffffff640,(char (*) [5])in_stack_fffffffffffff638);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)in_stack_fffffffffffff588);
            std::__cxx11::string::operator=(local_f8,local_380);
            std::__cxx11::string::~string(local_380);
          }
        }
        bVar2 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::contains<const_char_(&)[13],_0>
                          (in_stack_fffffffffffff5b0,(char (*) [13])in_stack_fffffffffffff5a8);
        if (bVar2) {
          pvVar9 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::at<const_char_(&)[13],_0>(in_stack_fffffffffffff640,in_stack_fffffffffffff638);
          bVar2 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::is_string(pvVar9);
          if (bVar2) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::at<const_char_(&)[13],_0>(in_stack_fffffffffffff640,in_stack_fffffffffffff638);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)in_stack_fffffffffffff588);
            std::__cxx11::string::operator=(local_118,local_3a0);
            std::__cxx11::string::~string(local_3a0);
          }
        }
        goto LAB_001a24fc;
      }
      pvVar9 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::at<const_char_(&)[4],_0>
                         (in_stack_fffffffffffff640,(char (*) [4])in_stack_fffffffffffff638);
      bVar2 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::is_string(pvVar9);
      if (!bVar2) goto LAB_001a2351;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::at<const_char_(&)[4],_0>(in_stack_fffffffffffff640,(char (*) [4])in_stack_fffffffffffff638);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::get<std::__cxx11::string,std::__cxx11::string>(in_stack_fffffffffffff598);
      bVar2 = std::operator!=(&in_stack_fffffffffffff590->etag,in_stack_fffffffffffff588);
      if (bVar2) {
        if (-1 < common_log_verbosity_thold) {
          pcVar5 = common_log_main();
          uVar7 = std::__cxx11::string::c_str();
          uVar14 = std::__cxx11::string::c_str();
          common_log_add(pcVar5,GGML_LOG_LEVEL_ERROR,"%s: Model URL mismatch: %s != %s\n",
                         "common_download_file_single",uVar7,uVar14);
        }
        local_1 = 0;
        local_50 = 1;
      }
      else {
        local_50 = 0;
      }
      std::__cxx11::string::~string(local_360);
      if (local_50 == 0) goto LAB_001a2351;
    }
    std::ifstream::~ifstream(local_320);
    if (local_50 == 0) goto LAB_001a2593;
  }
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f8);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)in_stack_fffffffffffff590);
  std::__cxx11::string::~string(local_c8);
LAB_001a377a:
  curl_slist_ptr::~curl_slist_ptr((curl_slist_ptr *)in_stack_fffffffffffff590);
  std::unique_ptr<void,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<void,_void_(*)(void_*)> *)in_stack_fffffffffffff5a0);
  return (bool)(local_1 & 1);
}

Assistant:

static bool common_download_file_single(const std::string & url, const std::string & path, const std::string & bearer_token) {
    // Initialize libcurl
    curl_ptr       curl(curl_easy_init(), &curl_easy_cleanup);
    curl_slist_ptr http_headers;
    if (!curl) {
        LOG_ERR("%s: error initializing libcurl\n", __func__);
        return false;
    }

    bool force_download = false;

    // Set the URL, allow to follow http redirection
    curl_easy_setopt(curl.get(), CURLOPT_URL, url.c_str());
    curl_easy_setopt(curl.get(), CURLOPT_FOLLOWLOCATION, 1L);

    http_headers.ptr = curl_slist_append(http_headers.ptr, "User-Agent: llama-cpp");
    // Check if hf-token or bearer-token was specified
    if (!bearer_token.empty()) {
        std::string auth_header = "Authorization: Bearer " + bearer_token;
        http_headers.ptr = curl_slist_append(http_headers.ptr, auth_header.c_str());
    }
    curl_easy_setopt(curl.get(), CURLOPT_HTTPHEADER, http_headers.ptr);

#if defined(_WIN32)
    // CURLSSLOPT_NATIVE_CA tells libcurl to use standard certificate store of
    //   operating system. Currently implemented under MS-Windows.
    curl_easy_setopt(curl.get(), CURLOPT_SSL_OPTIONS, CURLSSLOPT_NATIVE_CA);
#endif

    // Check if the file already exists locally
    auto file_exists = std::filesystem::exists(path);

    // If the file exists, check its JSON metadata companion file.
    std::string metadata_path = path + ".json";
    nlohmann::json metadata;
    std::string etag;
    std::string last_modified;

    if (file_exists) {
        // Try and read the JSON metadata file (note: stream autoclosed upon exiting this block).
        std::ifstream metadata_in(metadata_path);
        if (metadata_in.good()) {
            try {
                metadata_in >> metadata;
                LOG_INF("%s: previous metadata file found %s: %s\n", __func__, metadata_path.c_str(), metadata.dump().c_str());
                if (metadata.contains("url") && metadata.at("url").is_string()) {
                    auto previous_url = metadata.at("url").get<std::string>();
                    if (previous_url != url) {
                        LOG_ERR("%s: Model URL mismatch: %s != %s\n", __func__, url.c_str(), previous_url.c_str());
                        return false;
                    }
                }
                if (metadata.contains("etag") && metadata.at("etag").is_string()) {
                    etag = metadata.at("etag");
                }
                if (metadata.contains("lastModified") && metadata.at("lastModified").is_string()) {
                    last_modified = metadata.at("lastModified");
                }
            } catch (const nlohmann::json::exception & e) {
            LOG_ERR("%s: error reading metadata file %s: %s\n", __func__, metadata_path.c_str(), e.what());
                return false;
            }
        }
    } else {
        LOG_INF("%s: no previous model file found %s\n", __func__, path.c_str());
    }

    // Send a HEAD request to retrieve the etag and last-modified headers
    struct common_load_model_from_url_headers {
        std::string etag;
        std::string last_modified;
    };

    common_load_model_from_url_headers headers;

    {
        typedef size_t(*CURLOPT_HEADERFUNCTION_PTR)(char *, size_t, size_t, void *);
        auto header_callback = [](char * buffer, size_t /*size*/, size_t n_items, void * userdata) -> size_t {
            common_load_model_from_url_headers * headers = (common_load_model_from_url_headers *) userdata;

            static std::regex header_regex("([^:]+): (.*)\r\n");
            static std::regex etag_regex("ETag", std::regex_constants::icase);
            static std::regex last_modified_regex("Last-Modified", std::regex_constants::icase);

            std::string header(buffer, n_items);
            std::smatch match;
            if (std::regex_match(header, match, header_regex)) {
                const std::string & key = match[1];
                const std::string & value = match[2];
                if (std::regex_match(key, match, etag_regex)) {
                    headers->etag = value;
                } else if (std::regex_match(key, match, last_modified_regex)) {
                    headers->last_modified = value;
                }
            }
            return n_items;
        };

        curl_easy_setopt(curl.get(), CURLOPT_NOBODY, 1L); // will trigger the HEAD verb
        curl_easy_setopt(curl.get(), CURLOPT_NOPROGRESS, 1L); // hide head request progress
        curl_easy_setopt(curl.get(), CURLOPT_HEADERFUNCTION, static_cast<CURLOPT_HEADERFUNCTION_PTR>(header_callback));
        curl_easy_setopt(curl.get(), CURLOPT_HEADERDATA, &headers);

        bool was_perform_successful = curl_perform_with_retry(url, curl.get(), CURL_MAX_RETRY, CURL_RETRY_DELAY_SECONDS);
        if (!was_perform_successful) {
            return false;
        }

        long http_code = 0;
        curl_easy_getinfo(curl.get(), CURLINFO_RESPONSE_CODE, &http_code);
        if (http_code != 200) {
            // HEAD not supported, we don't know if the file has changed
            // force trigger downloading
            force_download = true;
            LOG_ERR("%s: HEAD invalid http status code received: %ld\n", __func__, http_code);
        }
    }

    bool should_download = !file_exists || force_download;
    if (!should_download) {
        if (!etag.empty() && etag != headers.etag) {
            LOG_WRN("%s: ETag header is different (%s != %s): triggering a new download\n", __func__, etag.c_str(), headers.etag.c_str());
            should_download = true;
        } else if (!last_modified.empty() && last_modified != headers.last_modified) {
            LOG_WRN("%s: Last-Modified header is different (%s != %s): triggering a new download\n", __func__, last_modified.c_str(), headers.last_modified.c_str());
            should_download = true;
        }
    }
    if (should_download) {
        std::string path_temporary = path + ".downloadInProgress";
        if (file_exists) {
            LOG_WRN("%s: deleting previous downloaded file: %s\n", __func__, path.c_str());
            if (remove(path.c_str()) != 0) {
                LOG_ERR("%s: unable to delete file: %s\n", __func__, path.c_str());
                return false;
            }
        }

        // Set the output file

        struct FILE_deleter {
            void operator()(FILE * f) const {
                fclose(f);
            }
        };

        std::unique_ptr<FILE, FILE_deleter> outfile(fopen(path_temporary.c_str(), "wb"));
        if (!outfile) {
            LOG_ERR("%s: error opening local file for writing: %s\n", __func__, path.c_str());
            return false;
        }

        typedef size_t(*CURLOPT_WRITEFUNCTION_PTR)(void * data, size_t size, size_t nmemb, void * fd);
        auto write_callback = [](void * data, size_t size, size_t nmemb, void * fd) -> size_t {
            return fwrite(data, size, nmemb, (FILE *)fd);
        };
        curl_easy_setopt(curl.get(), CURLOPT_NOBODY, 0L);
        curl_easy_setopt(curl.get(), CURLOPT_WRITEFUNCTION, static_cast<CURLOPT_WRITEFUNCTION_PTR>(write_callback));
        curl_easy_setopt(curl.get(), CURLOPT_WRITEDATA, outfile.get());

        //  display download progress
        curl_easy_setopt(curl.get(), CURLOPT_NOPROGRESS, 0L);

        // helper function to hide password in URL
        auto llama_download_hide_password_in_url = [](const std::string & url) -> std::string {
            std::size_t protocol_pos = url.find("://");
            if (protocol_pos == std::string::npos) {
                return url;  // Malformed URL
            }

            std::size_t at_pos = url.find('@', protocol_pos + 3);
            if (at_pos == std::string::npos) {
                return url;  // No password in URL
            }

            return url.substr(0, protocol_pos + 3) + "********" + url.substr(at_pos);
        };

        // start the download
        LOG_INF("%s: trying to download model from %s to %s (server_etag:%s, server_last_modified:%s)...\n", __func__,
            llama_download_hide_password_in_url(url).c_str(), path.c_str(), headers.etag.c_str(), headers.last_modified.c_str());
        bool was_perform_successful = curl_perform_with_retry(url, curl.get(), CURL_MAX_RETRY, CURL_RETRY_DELAY_SECONDS);
        if (!was_perform_successful) {
            return false;
        }

        long http_code = 0;
        curl_easy_getinfo (curl.get(), CURLINFO_RESPONSE_CODE, &http_code);
        if (http_code < 200 || http_code >= 400) {
            LOG_ERR("%s: invalid http status code received: %ld\n", __func__, http_code);
            return false;
        }

        // Causes file to be closed explicitly here before we rename it.
        outfile.reset();

        // Write the updated JSON metadata file.
        metadata.update({
            {"url", url},
            {"etag", headers.etag},
            {"lastModified", headers.last_modified}
        });
        std::ofstream(metadata_path) << metadata.dump(4);
        LOG_INF("%s: file metadata saved: %s\n", __func__, metadata_path.c_str());

        if (rename(path_temporary.c_str(), path.c_str()) != 0) {
            LOG_ERR("%s: unable to rename file: %s to %s\n", __func__, path_temporary.c_str(), path.c_str());
            return false;
        }
    }

    return true;
}